

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

mat4 * __thiscall
graphics101::Mesh::normalizingTransformation(mat4 *__return_storage_ptr__,Mesh *this)

{
  bool bVar1;
  float local_18;
  float local_14;
  Mesh *local_10;
  Mesh *this_local;
  
  local_10 = this;
  bVar1 = std::
          vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          ::empty(&this->positions);
  if (bVar1) {
    local_14 = 1.0;
    glm::mat<4,_4,_float,_(glm::qualifier)0>::mat(__return_storage_ptr__,&local_14);
  }
  else {
    local_18 = 1.0;
    glm::mat<4,_4,_float,_(glm::qualifier)0>::mat(__return_storage_ptr__,&local_18);
  }
  return __return_storage_ptr__;
}

Assistant:

mat4 Mesh::normalizingTransformation() const {
    // Your code goes here.
    
    // If there are no positions, return the identity.
    if( positions.empty() ) {
        return mat4(1.0);
    }
    
    // The identity matrix.
    // Replace this with your implementation.
    return mat4(1.0);
}